

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_ed25519_initPEM
              (LIBSSH2_SESSION *session,char *privkeyfile,uchar *passphrase,void **abstract)

{
  int iVar1;
  EVP_PKEY *ec_ctx;
  
  ec_ctx = (EVP_PKEY *)0x0;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_ed25519_dtor(session,abstract);
    *abstract = (void *)0x0;
  }
  iVar1 = _libssh2_ed25519_new_private(&ec_ctx,session,privkeyfile,passphrase);
  if (iVar1 == 0) {
    *abstract = ec_ctx;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
hostkey_method_ssh_ed25519_initPEM(LIBSSH2_SESSION * session,
                                   const char *privkeyfile,
                                   unsigned const char *passphrase,
                                   void **abstract)
{
    libssh2_ed25519_ctx *ec_ctx = NULL;
    int ret;

    if(*abstract) {
        hostkey_method_ssh_ed25519_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_ed25519_new_private(&ec_ctx, session,
                                       privkeyfile, passphrase);
    if(ret) {
        return -1;
    }

    *abstract = ec_ctx;

    return ret;
}